

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

M68kCPU * cpu_m68k_init_m68k(uc_struct_conflict3 *uc)

{
  M68kCPU *cs;
  M68kCPU *cpu;
  
  cs = (M68kCPU *)calloc(1,0x8a40);
  if (cs == (M68kCPU *)0x0) {
LAB_006eaaf3:
    cs = (M68kCPU *)0x0;
  }
  else {
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 7;
    }
    else if (8 < (uint)uc->cpu_model) {
      free(cs);
      goto LAB_006eaaf3;
    }
    (cs->parent_obj).cc = &(cs->cc).parent_class;
    (cs->parent_obj).uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)cs;
    cpu_class_init((uc_struct *)uc,&(cs->cc).parent_class);
    (cs->cc).parent_reset = (_func_void_CPUState_ptr *)(cs->cc).parent_class.reset;
    (cs->cc).parent_class.reset = m68k_cpu_reset;
    (cs->cc).parent_class.has_work = m68k_cpu_has_work;
    (cs->cc).parent_class.do_interrupt = m68k_cpu_do_interrupt_m68k;
    (cs->cc).parent_class.cpu_exec_interrupt = m68k_cpu_exec_interrupt_m68k;
    (cs->cc).parent_class.set_pc = m68k_cpu_set_pc;
    (cs->cc).parent_class.tlb_fill_cpu = m68k_cpu_tlb_fill_m68k;
    (cs->cc).parent_class.get_phys_page_debug = m68k_cpu_get_phys_page_debug_m68k;
    (cs->cc).parent_class.tcg_initialize = m68k_tcg_init_m68k;
    cpu_common_initfn((uc_struct *)uc,(CPUState *)cs);
    (cs->env).uc = uc;
    (cs->parent_obj).env_ptr = &cs->env;
    (cs->parent_obj).icount_decr_ptr = &(cs->neg).icount_decr;
    (*m68k_cpus_type_infos[uc->cpu_model].initfn)((CPUState *)cs);
    register_m68k_insns_m68k(&cs->env);
    cpu_exec_realizefn_m68k((CPUState *)cs);
    cpu_address_space_init_m68k((CPUState *)cs,0,(cs->parent_obj).memory);
    qemu_init_vcpu_m68k((CPUState *)cs);
  }
  return cs;
}

Assistant:

M68kCPU *cpu_m68k_init(struct uc_struct *uc)
{
    M68kCPU *cpu;
    CPUState *cs;
    CPUClass *cc;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_M68K_CFV4E; // cfv4e
    } else if (uc->cpu_model >= ARRAY_SIZE(m68k_cpus_type_infos)) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = cs;

    cpu_class_init(uc, cc);

    m68k_cpu_class_init(cc);

    cpu_common_initfn(uc, cs);

    m68k_cpu_initfn(uc, cs);

    m68k_cpus_type_infos[uc->cpu_model].initfn(cs);

    m68k_cpu_realizefn(cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    return cpu;
}